

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Reach.c
# Opt level: O3

DdNode * Llb_ManComputeImage(Llb_Man_t *p,DdNode *bInit,int fBackward)

{
  Llb_Grp_t *pGroup;
  Llb_Mtr_t *pLVar1;
  DdNode *pDVar2;
  DdNode *n;
  DdNode *n_00;
  int iVar3;
  int iVar4;
  int iGrpPlace;
  DdNode *f;
  DdManager *table;
  int iVar5;
  int iGrpPlace_00;
  
  Cudd_Ref(bInit);
  pLVar1 = p->pMatrix;
  if (2 < pLVar1->nCols) {
    iVar5 = pLVar1->nCols + -1;
    iGrpPlace_00 = 1;
    iVar4 = -1;
    f = bInit;
    do {
      iVar3 = iVar5 + iVar4;
      if (fBackward == 0) {
        iVar3 = iGrpPlace_00;
      }
      pGroup = pLVar1->pColGrps[iVar3];
      pDVar2 = Llb_ManConstructGroupBdd(p,pGroup);
      if (pDVar2 == (DdNode *)0x0) {
        table = p->dd;
LAB_007d49ee:
        Cudd_RecursiveDeref(table,f);
        return (DdNode *)0x0;
      }
      Cudd_Ref(pDVar2);
      n = Llb_ManConstructQuantCubeIntern(p,pGroup,iGrpPlace,fBackward);
      Cudd_Ref(n);
      n_00 = Cudd_bddExistAbstract(p->dd,pDVar2,n);
      if (n_00 == (DdNode *)0x0) {
        Cudd_RecursiveDeref(p->dd,pDVar2);
        table = p->dd;
        f = n;
        goto LAB_007d49ee;
      }
      Cudd_Ref(n_00);
      Cudd_RecursiveDeref(p->dd,pDVar2);
      Cudd_RecursiveDeref(p->dd,n);
      if (fBackward == 0) {
        pDVar2 = Llb_ManConstructQuantCubeFwd(p,pGroup,iGrpPlace_00);
      }
      else {
        pDVar2 = Llb_ManConstructQuantCubeBwd(p,pGroup,iVar5 + iVar4);
      }
      Cudd_Ref(pDVar2);
      bInit = Cudd_bddAndAbstract(p->dd,f,n_00,pDVar2);
      if (bInit == (DdNode *)0x0) {
        Cudd_RecursiveDeref(p->dd,f);
        Cudd_RecursiveDeref(p->dd,n_00);
        table = p->dd;
        f = pDVar2;
        goto LAB_007d49ee;
      }
      Cudd_Ref(bInit);
      Cudd_RecursiveDeref(p->dd,f);
      Cudd_RecursiveDeref(p->dd,n_00);
      Cudd_RecursiveDeref(p->dd,pDVar2);
      iGrpPlace_00 = iGrpPlace_00 + 1;
      pLVar1 = p->pMatrix;
      iVar5 = pLVar1->nCols + -1;
      iVar4 = iVar4 + -1;
      f = bInit;
    } while (iGrpPlace_00 < iVar5);
  }
  Cudd_Deref(bInit);
  return bInit;
}

Assistant:

DdNode * Llb_ManComputeImage( Llb_Man_t * p, DdNode * bInit, int fBackward )
{
    int fCheckSupport = 0;
    Llb_Grp_t * pGroup;
    DdNode * bImage, * bGroup, * bCube, * bTemp;
    int k, Index;
    bImage = bInit;  Cudd_Ref( bImage );
    for ( k = 1; k < p->pMatrix->nCols-1; k++ )
    {
        if ( fBackward )
            Index = p->pMatrix->nCols - 1 - k;
        else
            Index = k;

        // compute group BDD
        pGroup = p->pMatrix->pColGrps[Index];
        bGroup = Llb_ManConstructGroupBdd( p, pGroup );
        if ( bGroup == NULL )
        {
            Cudd_RecursiveDeref( p->dd, bImage );
            return NULL;
        }
        Cudd_Ref( bGroup );
        // quantify variables appearing only in this group
        bCube  = Llb_ManConstructQuantCubeIntern( p, pGroup, Index, fBackward );       Cudd_Ref( bCube );
        bGroup = Cudd_bddExistAbstract( p->dd, bTemp = bGroup, bCube );         
        if ( bGroup == NULL )
        {
            Cudd_RecursiveDeref( p->dd, bTemp );
            Cudd_RecursiveDeref( p->dd, bCube );
            return NULL;
        }
        Cudd_Ref( bGroup );
        Cudd_RecursiveDeref( p->dd, bTemp );
        Cudd_RecursiveDeref( p->dd, bCube );
        // perform partial product
        if ( fBackward )
            bCube  = Llb_ManConstructQuantCubeBwd( p, pGroup, Index );
        else
            bCube  = Llb_ManConstructQuantCubeFwd( p, pGroup, Index );
        Cudd_Ref( bCube );
//        bImage = Extra_bddAndAbstractTime( p->dd, bTemp = bImage, bGroup, bCube, p->pPars->TimeTarget );   
        bImage = Cudd_bddAndAbstract( p->dd, bTemp = bImage, bGroup, bCube );   
        if ( bImage == NULL )
        {
            Cudd_RecursiveDeref( p->dd, bTemp );
            Cudd_RecursiveDeref( p->dd, bGroup );
            Cudd_RecursiveDeref( p->dd, bCube );
            return NULL;
        }
        Cudd_Ref( bImage );
        Cudd_RecursiveDeref( p->dd, bTemp );
        Cudd_RecursiveDeref( p->dd, bGroup );
        Cudd_RecursiveDeref( p->dd, bCube );
    }

    // make sure image depends on next state vars
    if ( fCheckSupport )
    {
        bCube = Cudd_Support( p->dd, bImage );    Cudd_Ref( bCube );
        for ( bTemp = bCube; bTemp != p->dd->one; bTemp = cuddT(bTemp) )
        {
            int ObjId = Vec_IntEntry( p->vVar2Obj, bTemp->index );
            Aig_Obj_t * pObj = Aig_ManObj( p->pAig, ObjId );
            if ( !Saig_ObjIsLi(p->pAig, pObj) )
                printf( "Var %d assigned to obj %d that is not LI\n", bTemp->index, ObjId );
        }
        Cudd_RecursiveDeref( p->dd, bCube );
    }
    Cudd_Deref( bImage );
    return bImage;
}